

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_B_upper.c
# Opt level: O0

void test_option_B_upper(void)

{
  wchar_t wVar1;
  int r;
  stat_conflict st;
  char *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  wchar_t in_stack_ffffffffffffff74;
  char *in_stack_ffffffffffffff78;
  wchar_t in_stack_ffffffffffffff80;
  wchar_t in_stack_ffffffffffffff84;
  char *in_stack_ffffffffffffff88;
  __gid_t in_stack_ffffffffffffff90;
  wchar_t in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffff98;
  
  assertion_make_file(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,in_stack_ffffffffffffff88,
                      in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78)
  ;
  wVar1 = systemf("echo file | %s -o > small.cpio 2>small.err",testprog);
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(wVar1,in_stack_ffffffffffffff68),in_stack_ffffffffffffff60,0,
                      (char *)0x10fa9c,
                      (void *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  assertion_text_file_contents
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,in_stack_ffffffffffffff88,
             (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  stat("small.cpio",(stat *)&stack0xffffffffffffff70);
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(wVar1,in_stack_ffffffffffffff68),in_stack_ffffffffffffff60,0,
                      (char *)0x10fafa,
                      (void *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(wVar1,in_stack_ffffffffffffff68),in_stack_ffffffffffffff60,0,
                      (char *)0x10fb2d,
                      (void *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  wVar1 = systemf("echo file | %s -oB > large.cpio 2>large.err",testprog);
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(wVar1,in_stack_ffffffffffffff68),in_stack_ffffffffffffff60,0,
                      (char *)0x10fb7a,
                      (void *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  assertion_text_file_contents
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,in_stack_ffffffffffffff88,
             (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  stat("large.cpio",(stat *)&stack0xffffffffffffff70);
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(wVar1,in_stack_ffffffffffffff68),in_stack_ffffffffffffff60,0,
                      (char *)0x10fbd8,
                      (void *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  assertion_equal_int(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      CONCAT44(wVar1,in_stack_ffffffffffffff68),in_stack_ffffffffffffff60,0,
                      (char *)0x10fc0b,
                      (void *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  return;
}

Assistant:

DEFINE_TEST(test_option_B_upper)
{
	struct stat st;
	int r;

	/*
	 * Create a file on disk.
	 */
	assertMakeFile("file", 0644, NULL);

	/* Create an archive without -B; this should be 512 bytes. */
	r = systemf("echo file | %s -o > small.cpio 2>small.err", testprog);
	assertEqualInt(r, 0);
	assertTextFileContents("1 block\n", "small.err");
	assertEqualInt(0, stat("small.cpio", &st));
	assertEqualInt(512, st.st_size);

	/* Create an archive with -B; this should be 5120 bytes. */
	r = systemf("echo file | %s -oB > large.cpio 2>large.err", testprog);
	assertEqualInt(r, 0);
	assertTextFileContents("1 block\n", "large.err");
	assertEqualInt(0, stat("large.cpio", &st));
	assertEqualInt(5120, st.st_size);
}